

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O2

void InitMarshalData(SstStream Stream)

{
  int *CountP;
  FMFieldList *FieldP;
  undefined8 *puVar1;
  void *pvVar2;
  void *pvVar3;
  undefined8 uVar4;
  
  pvVar2 = calloc(1,0x78);
  Stream->WriterMarshalData = pvVar2;
  pvVar3 = malloc(0x28);
  *(void **)((long)pvVar2 + 8) = pvVar3;
  CountP = (int *)((long)pvVar2 + 0x18);
  FieldP = (FMFieldList *)((long)pvVar2 + 0x20);
  uVar4 = create_local_FMcontext();
  *(undefined8 *)((long)pvVar2 + 0x10) = uVar4;
  AddSimpleField(FieldP,CountP,"BitFieldCount","integer",8);
  AddSimpleField(FieldP,CountP,"BitField","integer[BitFieldCount]",8);
  AddSimpleField(FieldP,CountP,"DataBlockSize","integer",8);
  RecalcMarshalStorageSize(Stream);
  puVar1 = (undefined8 *)Stream->M;
  *puVar1 = 0;
  pvVar2 = malloc(8);
  puVar1[1] = pvVar2;
  puVar1[2] = 0;
  return;
}

Assistant:

static void InitMarshalData(SstStream Stream)
{
    struct FFSWriterMarshalBase *Info = malloc(sizeof(struct FFSWriterMarshalBase));
    struct FFSMetadataInfoStruct *MBase;

    memset(Info, 0, sizeof(*Info));
    Stream->WriterMarshalData = Info;
    Info->RecCount = 0;
    Info->RecList = malloc(sizeof(Info->RecList[0]));
    Info->MetaFieldCount = 0;
    Info->MetaFields = NULL;
    Info->DataFieldCount = 0;
    Info->DataFields = NULL;
    Info->LocalFMContext = create_local_FMcontext();
    AddSimpleField(&Info->MetaFields, &Info->MetaFieldCount, "BitFieldCount", "integer",
                   sizeof(size_t));
    AddSimpleField(&Info->MetaFields, &Info->MetaFieldCount, "BitField", "integer[BitFieldCount]",
                   sizeof(size_t));
    AddSimpleField(&Info->MetaFields, &Info->MetaFieldCount, "DataBlockSize", "integer",
                   sizeof(size_t));
    RecalcMarshalStorageSize(Stream);
    MBase = Stream->M;
    MBase->BitFieldCount = 0;
    MBase->BitField = malloc(sizeof(size_t));
    MBase->DataBlockSize = 0;
}